

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

void __thiscall duckdb_parquet::ColumnChunk::ColumnChunk(ColumnChunk *this,ColumnChunk *other138)

{
  *(undefined ***)this = &PTR__ColumnChunk_004de2e0;
  (this->file_path)._M_dataplus._M_p = (pointer)&(this->file_path).field_2;
  (this->file_path)._M_string_length = 0;
  (this->file_path).field_2._M_local_buf[0] = '\0';
  ColumnMetaData::ColumnMetaData(&this->meta_data);
  ColumnCryptoMetaData::ColumnCryptoMetaData(&this->crypto_metadata);
  (this->encrypted_column_metadata)._M_dataplus._M_p =
       (pointer)&(this->encrypted_column_metadata).field_2;
  (this->encrypted_column_metadata)._M_string_length = 0;
  (this->encrypted_column_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_ColumnChunk__isset)0x0;
  std::__cxx11::string::_M_assign((string *)&this->file_path);
  this->file_offset = other138->file_offset;
  ColumnMetaData::operator=(&this->meta_data,&other138->meta_data);
  this->offset_index_offset = other138->offset_index_offset;
  this->offset_index_length = other138->offset_index_length;
  this->column_index_offset = other138->column_index_offset;
  this->column_index_length = other138->column_index_length;
  ColumnCryptoMetaData::operator=(&this->crypto_metadata,&other138->crypto_metadata);
  std::__cxx11::string::_M_assign((string *)&this->encrypted_column_metadata);
  this->__isset = other138->__isset;
  return;
}

Assistant:

ColumnChunk::ColumnChunk(const ColumnChunk& other138) {
  file_path = other138.file_path;
  file_offset = other138.file_offset;
  meta_data = other138.meta_data;
  offset_index_offset = other138.offset_index_offset;
  offset_index_length = other138.offset_index_length;
  column_index_offset = other138.column_index_offset;
  column_index_length = other138.column_index_length;
  crypto_metadata = other138.crypto_metadata;
  encrypted_column_metadata = other138.encrypted_column_metadata;
  __isset = other138.__isset;
}